

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_4> *in_RCX;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  float afStack_f0 [6];
  float local_d8 [4];
  float local_c8 [2];
  ulong local_c0;
  undefined4 local_b8;
  float local_b0 [4];
  float local_a0 [4];
  float local_90 [6];
  Vector<float,_4> local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Matrix<float,_4,_4> local_50;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_68 = (evalCtx->coords).m_data[0];
    fStack_64 = (evalCtx->coords).m_data[1];
    fStack_60 = (evalCtx->coords).m_data[2];
    fStack_5c = (evalCtx->coords).m_data[3];
  }
  else {
    local_68 = (float)0x3fb33333;
    fStack_64 = (float)0x3e4ccccd;
    fStack_60 = (float)0xbf000000;
    fStack_5c = (float)0x3f333333;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data[0] = (evalCtx->coords).m_data[0];
    local_78.m_data[1] = (evalCtx->coords).m_data[1];
    local_78.m_data[2] = (evalCtx->coords).m_data[2];
    local_78.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    local_78.m_data[0] = (float)0x3e4ccccd;
    local_78.m_data[1] = (float)0xbf800000;
    local_78.m_data[2] = (float)0x3f000000;
    local_78.m_data[3] = (float)0x3f4ccccd;
  }
  afStack_f0[0] = 2.5494767e-38;
  afStack_f0[1] = 0.0;
  outerProduct<float,4,4>(&local_50,(MatrixCaseUtils *)&local_68,&local_78,in_RCX);
  local_90[0] = local_50.m_data.m_data[0].m_data[0];
  local_90[1] = local_50.m_data.m_data[0].m_data[1];
  local_90[2] = local_50.m_data.m_data[0].m_data[2];
  local_a0[0] = local_50.m_data.m_data[1].m_data[1];
  local_a0[1] = local_50.m_data.m_data[1].m_data[2];
  local_a0[2] = local_50.m_data.m_data[1].m_data[3];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar1 = 0;
  do {
    local_d8[lVar1] = local_90[lVar1] + local_a0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_b0[0] = local_50.m_data.m_data[2].m_data[2];
  local_b0[1] = local_50.m_data.m_data[2].m_data[3];
  local_b0[2] = local_50.m_data.m_data[2].m_data[0];
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c0 = local_c0 & 0xffffffff00000000;
  lVar1 = 0;
  do {
    local_c8[lVar1] = local_d8[lVar1] + local_b0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_90[3] = local_50.m_data.m_data[3].m_data[3];
  local_90[4] = local_50.m_data.m_data[3].m_data[0];
  local_90[5] = local_50.m_data.m_data[3].m_data[1];
  afStack_f0[2] = 0.0;
  afStack_f0[3] = 0.0;
  afStack_f0[4] = 0.0;
  lVar1 = 0;
  do {
    afStack_f0[lVar1 + 2] = local_c8[lVar1] + local_90[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_c0 = 0x100000000;
  local_b8 = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_c8[lVar1]] = afStack_f0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}